

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O2

GO Omega_h::find_total_globals(CommPtr *comm,Read<long> *globals)

{
  long lVar1;
  GO GVar2;
  Write<int> WStack_28;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_18,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<long>::Write(&WStack_28,(Write<int> *)globals);
  lVar1 = get_max<long>((CommPtr *)&local_18,(Read<long> *)&WStack_28);
  Write<long>::~Write((Write<long> *)&WStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  GVar2 = 0;
  if (-1 < lVar1) {
    GVar2 = lVar1 + 1;
  }
  return GVar2;
}

Assistant:

GO find_total_globals(CommPtr comm, Read<GO> globals) {
  auto const a = get_max(comm, globals);
  if (a < 0) return 0;
  return a + 1;
}